

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode tool_setopt_bitmask(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                            NameValueUnsigned *nvlist,long lval)

{
  CURLcode CVar1;
  size_t sVar2;
  unsigned_long rest;
  char *pcVar3;
  char preamble [80];
  
  CVar1 = curl_easy_setopt(curl,tag,lval);
  if ((CVar1 == CURLE_OK && lval != 0) && config->libcurl != (char *)0x0) {
    curl_msnprintf(preamble,0x50,"curl_easy_setopt(hnd, %s, ",name);
    for (; nvlist->name != (char *)0x0; nvlist = nvlist + 1) {
      if ((nvlist->value & ~lval) == 0) {
        pcVar3 = ");";
        lval = lval & ~nvlist->value;
        if (lval != 0) {
          pcVar3 = " |";
        }
        CVar1 = easysrc_addf(&easysrc_code,"%s(long)%s%s",preamble,nvlist->name,pcVar3);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        if (lval == 0) goto LAB_0011b529;
        sVar2 = strlen(preamble);
        curl_msnprintf(preamble,0x50,"%*s",sVar2,"");
      }
    }
    if ((lval != 0) &&
       (CVar1 = easysrc_addf(&easysrc_code,"%s%luUL);",preamble,lval), CVar1 != CURLE_OK)) {
      return CVar1;
    }
LAB_0011b529:
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt_bitmask(CURL *curl, struct GlobalConfig *config,
                             const char *name, CURLoption tag,
                             const struct NameValueUnsigned *nvlist,
                             long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    char preamble[80];
    unsigned long rest = (unsigned long)lval;
    const struct NameValueUnsigned *nv = NULL;
    msnprintf(preamble, sizeof(preamble),
              "curl_easy_setopt(hnd, %s, ", name);
    for(nv = nvlist; nv->name; nv++) {
      if((nv->value & ~ rest) == 0) {
        /* all value flags contained in rest */
        rest &= ~ nv->value;    /* remove bits handled here */
        CODE3("%s(long)%s%s",
              preamble, nv->name, rest ? " |" : ");");
        if(!rest)
          break;                /* handled them all */
        /* replace with all spaces for continuation line */
        msnprintf(preamble, sizeof(preamble), "%*s", strlen(preamble), "");
      }
    }
    /* If any bits have no definition, output an explicit value.
     * This could happen if new bits are defined and used
     * but the NameValue list is not updated. */
    if(rest)
      CODE2("%s%luUL);", preamble, rest);
  }

 nomem:
  return ret;
}